

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

QMetaProperty * __thiscall
QMetaObject::userProperty(QMetaProperty *__return_storage_ptr__,QMetaObject *this)

{
  QMetaObject *pQVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = (this->d).data[6];
  for (pQVar1 = (this->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
      pQVar1 = (pQVar1->d).superdata.direct) {
    uVar2 = uVar2 + (pQVar1->d).data[6];
  }
  if (0 < (int)uVar2) {
    iVar3 = uVar2 + 1;
    do {
      (__return_storage_ptr__->menum).mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->menum).data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->data).d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      property(__return_storage_ptr__,this,iVar3 + -2);
      if ((__return_storage_ptr__->mobj != (QMetaObject *)0x0) &&
         ((*(byte *)((long)(__return_storage_ptr__->data).d + 10) & 0x10) != 0)) {
        return __return_storage_ptr__;
      }
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  (__return_storage_ptr__->menum).mobj = (QMetaObject *)0x0;
  (__return_storage_ptr__->menum).data.d = (uint *)0x0;
  __return_storage_ptr__->mobj = (QMetaObject *)0x0;
  (__return_storage_ptr__->data).d = (uint *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QMetaProperty QMetaObject::userProperty() const
{
    const int propCount = propertyCount();
    for (int i = propCount - 1; i >= 0; --i) {
        const QMetaProperty prop = property(i);
        if (prop.isUser())
            return prop;
    }
    return QMetaProperty();
}